

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O2

bool __thiscall
cmAddExecutableCommand::InitialPass
          (cmAddExecutableCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *input;
  cmMakefile *pcVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  PolicyStatus PVar11;
  pointer pbVar12;
  ostream *poVar13;
  long lVar14;
  cmTarget *pcVar15;
  PolicyID id;
  MessageType t;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  allocator local_1f1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  input = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar12 - (long)input) < 0x21) {
    std::__cxx11::string::string
              ((string *)&e,"called with incorrect number of arguments",(allocator *)&srclists);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    goto LAB_003523a2;
  }
  bVar8 = false;
  bVar9 = false;
  bVar4 = false;
  bVar10 = false;
  bVar5 = false;
  bVar3 = false;
  __first._M_current = input;
  while (__first._M_current = __first._M_current + 1, __first._M_current != pbVar12) {
    bVar6 = std::operator==(__first._M_current,"WIN32");
    bVar7 = true;
    if (!bVar6) {
      bVar6 = std::operator==(__first._M_current,"MACOSX_BUNDLE");
      bVar7 = bVar3;
      if (bVar6) {
        bVar5 = true;
      }
      else {
        bVar6 = std::operator==(__first._M_current,"EXCLUDE_FROM_ALL");
        if (bVar6) {
          bVar10 = true;
        }
        else {
          bVar6 = std::operator==(__first._M_current,"IMPORTED");
          if (bVar6) {
            bVar8 = true;
          }
          else if ((bVar8) && (bVar6 = std::operator==(__first._M_current,"GLOBAL"), bVar6)) {
            bVar9 = true;
          }
          else {
            bVar6 = std::operator==(__first._M_current,"ALIAS");
            if (!bVar6) break;
            bVar4 = true;
          }
        }
      }
    }
    bVar3 = bVar7;
    pbVar12 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar7 = cmGeneratorExpression::IsValidTargetName(input);
  if ((!bVar7) || (bVar7 = cmGlobalGenerator::IsReservedTarget(input), bVar7)) {
LAB_003524e5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    PVar11 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
    if (PVar11 - NEW < 3) {
      t = FATAL_ERROR;
      bVar7 = true;
LAB_00352553:
      poVar13 = std::operator<<((ostream *)&e,"The target name \"");
      poVar13 = std::operator<<(poVar13,(string *)input);
      std::operator<<(poVar13,
                      "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                     );
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,t,(string *)&srclists);
      std::__cxx11::string::~string((string *)&srclists);
      if (bVar7) goto LAB_003525b6;
    }
    else if (PVar11 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&srclists,(cmPolicies *)0x25,id);
      poVar13 = std::operator<<((ostream *)&e,(string *)&srclists);
      std::operator<<(poVar13,"\n");
      std::__cxx11::string::~string((string *)&srclists);
      bVar7 = false;
      t = AUTHOR_WARNING;
      goto LAB_00352553;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    if (!bVar8) goto LAB_0035266a;
LAB_003525e7:
    if (bVar3) {
      std::__cxx11::string::string
                ((string *)&e,"may not be given WIN32 for an IMPORTED target.",
                 (allocator *)&srclists);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      goto LAB_003523a2;
    }
    if (bVar5) {
      std::__cxx11::string::string
                ((string *)&e,"may not be given MACOSX_BUNDLE for an IMPORTED target.",
                 (allocator *)&srclists);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      goto LAB_003523a2;
    }
    if (bVar10 != false) {
      std::__cxx11::string::string
                ((string *)&e,"may not be given EXCLUDE_FROM_ALL for an IMPORTED target.",
                 (allocator *)&srclists);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      goto LAB_003523a2;
    }
    bVar3 = true;
    if (bVar4) goto LAB_00352678;
    pcVar15 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,input,false);
    if (pcVar15 == (cmTarget *)0x0) {
      cmMakefile::AddImportedTarget((this->super_cmCommand).Makefile,input,EXECUTABLE,bVar9);
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar13 = std::operator<<((ostream *)&e,"cannot create imported target \"");
    poVar13 = std::operator<<(poVar13,(string *)input);
    std::operator<<(poVar13,"\" because another target with the same name already exists.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
  }
  else {
    if (bVar8) goto LAB_003525e7;
    if ((!bVar4) && (lVar14 = std::__cxx11::string::find((char)input,0x3a), lVar14 != -1))
    goto LAB_003524e5;
LAB_0035266a:
    if (!bVar4) {
      _e = (pointer)local_198;
      local_198[0]._M_local_buf[0] = '\0';
      bVar9 = cmMakefile::EnforceUniqueName
                        ((this->super_cmCommand).Makefile,input,(string *)&e,false);
      if (bVar9) {
        std::__cxx11::string::~string((string *)&e);
        __last._M_current =
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__first._M_current != __last._M_current) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&srclists,
                     __first,__last,(allocator_type *)&e);
          pcVar15 = cmMakefile::AddExecutable
                              ((this->super_cmCommand).Makefile,(input->_M_dataplus)._M_p,&srclists,
                               bVar10);
          if (bVar3) {
            std::__cxx11::string::string((string *)&e,"WIN32_EXECUTABLE",&local_1f1);
            cmTarget::SetProperty(pcVar15,(string *)&e,"ON");
            std::__cxx11::string::~string((string *)&e);
          }
          if (bVar5) {
            std::__cxx11::string::string((string *)&e,"MACOSX_BUNDLE",&local_1f1);
            cmTarget::SetProperty(pcVar15,(string *)&e,"ON");
            std::__cxx11::string::~string((string *)&e);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&srclists);
          return true;
        }
        std::__cxx11::string::string
                  ((string *)&e,"called with incorrect number of arguments, no sources provided",
                   (allocator *)&srclists);
        cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      }
      else {
        cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      }
      goto LAB_003523a2;
    }
    bVar3 = false;
LAB_00352678:
    bVar8 = cmGeneratorExpression::IsValidTargetName(input);
    if (!bVar8) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                     "Invalid name for ALIAS: ",input);
      cmCommand::SetError(&this->super_cmCommand,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
LAB_003523a2:
      std::__cxx11::string::~string((string *)&e);
      return false;
    }
    if (bVar10) {
      std::__cxx11::string::string
                ((string *)&e,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",(allocator *)&srclists);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      goto LAB_003523a2;
    }
    if ((bVar3) || (bVar9)) {
      std::__cxx11::string::string
                ((string *)&e,"IMPORTED with ALIAS is not allowed.",(allocator *)&srclists);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      goto LAB_003523a2;
    }
    if ((long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start == 0x60) {
      pcVar2 = ((__first._M_current)->_M_dataplus)._M_p;
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&e,pcVar2,(allocator *)&srclists);
      bVar10 = cmMakefile::IsAlias(pcVar1,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if (bVar10) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar13 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
        poVar13 = std::operator<<(poVar13,(string *)input);
        poVar13 = std::operator<<(poVar13,"\" because target \"");
        poVar13 = std::operator<<(poVar13,pcVar2);
        std::operator<<(poVar13,"\" is itself an ALIAS.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      }
      else {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&e,pcVar2,(allocator *)&srclists);
        pcVar15 = cmMakefile::FindTargetToUse(pcVar1,(string *)&e,true);
        std::__cxx11::string::~string((string *)&e);
        if (pcVar15 == (cmTarget *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar13 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
          poVar13 = std::operator<<(poVar13,(string *)input);
          poVar13 = std::operator<<(poVar13,"\" because target \"");
          poVar13 = std::operator<<(poVar13,pcVar2);
          std::operator<<(poVar13,"\" does not already exist.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
        }
        else if (pcVar15->TargetTypeValue == EXECUTABLE) {
          if (pcVar15->IsImportedTarget != true) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::string::string((string *)&e,pcVar2,(allocator *)&srclists);
            cmMakefile::AddAlias(pcVar1,input,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
            return true;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar13 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
          poVar13 = std::operator<<(poVar13,(string *)input);
          poVar13 = std::operator<<(poVar13,"\" because target \"");
          poVar13 = std::operator<<(poVar13,pcVar2);
          std::operator<<(poVar13,"\" is IMPORTED.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar13 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
          poVar13 = std::operator<<(poVar13,(string *)input);
          poVar13 = std::operator<<(poVar13,"\" because target \"");
          poVar13 = std::operator<<(poVar13,pcVar2);
          std::operator<<(poVar13,"\" is not an executable.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"ALIAS requires exactly one target argument.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
    }
  }
  std::__cxx11::string::~string((string *)&srclists);
LAB_003525b6:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return false;
}

Assistant:

bool cmAddExecutableCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while (s != args.end()) {
    if (*s == "WIN32") {
      ++s;
      use_win32 = true;
    } else if (*s == "MACOSX_BUNDLE") {
      ++s;
      use_macbundle = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (*s == "ALIAS") {
      ++s;
      isAlias = true;
    } else {
      break;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = exename.find(':') == std::string::npos;
  }
  if (!nameOk) {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0037)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
    }
    if (issueMessage) {
      /* clang-format off */
      e << "The target name \"" << exename <<
          "\" is reserved or not valid for certain "
          "CMake features, such as generator expressions, and may result "
          "in undefined behavior.";
      /* clang-format on */
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR) {
        return false;
      }
    }
  }

  // Special modifiers are not allowed with IMPORTED signature.
  if (importTarget && (use_win32 || use_macbundle || excludeFromAll)) {
    if (use_win32) {
      this->SetError("may not be given WIN32 for an IMPORTED target.");
    } else if (use_macbundle) {
      this->SetError("may not be given MACOSX_BUNDLE for an IMPORTED target.");
    } else // if(excludeFromAll)
    {
      this->SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
    }
    return false;
  }
  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(exename)) {
      this->SetError("Invalid name for ALIAS: " + exename);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    const char* aliasedName = s->c_str();
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" does not already "
                          "exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType type = aliasedTarget->GetType();
    if (type != cmStateEnums::EXECUTABLE) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is not an "
                          "executable.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is IMPORTED.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(exename, aliasedName);
    return true;
  }

  // Handle imported target creation.
  if (importTarget) {
    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(exename)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << exename
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(exename, cmStateEnums::EXECUTABLE,
                                      importGlobal);
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(exename, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  if (s == args.end()) {
    this->SetError(
      "called with incorrect number of arguments, no sources provided");
    return false;
  }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt =
    this->Makefile->AddExecutable(exename.c_str(), srclists, excludeFromAll);
  if (use_win32) {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
  }
  if (use_macbundle) {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
  }

  return true;
}